

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pinifile_test.cpp
# Opt level: O3

bool create_test_ini_file(bool last_empty_section)

{
  char *pcVar1;
  undefined1 auVar2 [16];
  int iVar3;
  FILE *__s;
  long lVar4;
  long lVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  short sVar10;
  short sVar11;
  short sVar13;
  short sVar15;
  short sVar17;
  short sVar19;
  short sVar21;
  short sVar23;
  short sVar25;
  short sVar26;
  short sVar28;
  short sVar30;
  short sVar32;
  short sVar34;
  short sVar36;
  short sVar38;
  short sVar12;
  short sVar14;
  short sVar16;
  short sVar18;
  short sVar20;
  short sVar22;
  short sVar24;
  short sVar27;
  short sVar29;
  short sVar31;
  short sVar33;
  short sVar35;
  short sVar37;
  short sVar39;
  
  __s = fopen("./p_ini_test_file.ini","w");
  if (__s == (FILE *)0x0) {
    bVar6 = false;
  }
  else {
    lVar4 = p_malloc0(0x801);
    auVar2 = _DAT_00104030;
    lVar5 = 0;
    auVar7 = _DAT_00104010;
    auVar8 = _DAT_00104020;
    do {
      auVar9 = pmulhuw(auVar8,auVar2);
      sVar10 = auVar8._0_2_ + (auVar9._0_2_ >> 4) * -0x14;
      sVar12 = auVar8._2_2_;
      sVar11 = sVar12 + (auVar9._2_2_ >> 4) * -0x14;
      sVar14 = auVar8._4_2_;
      sVar13 = sVar14 + (auVar9._4_2_ >> 4) * -0x14;
      sVar16 = auVar8._6_2_;
      sVar15 = sVar16 + (auVar9._6_2_ >> 4) * -0x14;
      sVar18 = auVar8._8_2_;
      sVar17 = sVar18 + (auVar9._8_2_ >> 4) * -0x14;
      sVar20 = auVar8._10_2_;
      sVar19 = sVar20 + (auVar9._10_2_ >> 4) * -0x14;
      sVar22 = auVar8._12_2_;
      sVar24 = auVar8._14_2_;
      sVar21 = sVar22 + (auVar9._12_2_ >> 4) * -0x14;
      sVar23 = sVar24 + (auVar9._14_2_ >> 4) * -0x14;
      auVar9 = pmulhuw(auVar7,auVar2);
      sVar25 = auVar7._0_2_ + (auVar9._0_2_ >> 4) * -0x14;
      sVar27 = auVar7._2_2_;
      sVar26 = sVar27 + (auVar9._2_2_ >> 4) * -0x14;
      sVar29 = auVar7._4_2_;
      sVar28 = sVar29 + (auVar9._4_2_ >> 4) * -0x14;
      sVar31 = auVar7._6_2_;
      sVar30 = sVar31 + (auVar9._6_2_ >> 4) * -0x14;
      sVar33 = auVar7._8_2_;
      sVar32 = sVar33 + (auVar9._8_2_ >> 4) * -0x14;
      sVar35 = auVar7._10_2_;
      sVar34 = sVar35 + (auVar9._10_2_ >> 4) * -0x14;
      sVar37 = auVar7._12_2_;
      sVar39 = auVar7._14_2_;
      sVar36 = sVar37 + (auVar9._12_2_ >> 4) * -0x14;
      sVar38 = sVar39 + (auVar9._14_2_ >> 4) * -0x14;
      pcVar1 = (char *)(lVar4 + lVar5);
      *pcVar1 = ((0 < sVar10) * (sVar10 < 0x100) * (char)sVar10 - (0xff < sVar10)) + 'a';
      pcVar1[1] = ((0 < sVar11) * (sVar11 < 0x100) * (char)sVar11 - (0xff < sVar11)) + 'a';
      pcVar1[2] = ((0 < sVar13) * (sVar13 < 0x100) * (char)sVar13 - (0xff < sVar13)) + 'a';
      pcVar1[3] = ((0 < sVar15) * (sVar15 < 0x100) * (char)sVar15 - (0xff < sVar15)) + 'a';
      pcVar1[4] = ((0 < sVar17) * (sVar17 < 0x100) * (char)sVar17 - (0xff < sVar17)) + 'a';
      pcVar1[5] = ((0 < sVar19) * (sVar19 < 0x100) * (char)sVar19 - (0xff < sVar19)) + 'a';
      pcVar1[6] = ((0 < sVar21) * (sVar21 < 0x100) * (char)sVar21 - (0xff < sVar21)) + 'a';
      pcVar1[7] = ((0 < sVar23) * (sVar23 < 0x100) * (char)sVar23 - (0xff < sVar23)) + 'a';
      pcVar1[8] = ((0 < sVar25) * (sVar25 < 0x100) * (char)sVar25 - (0xff < sVar25)) + 'a';
      pcVar1[9] = ((0 < sVar26) * (sVar26 < 0x100) * (char)sVar26 - (0xff < sVar26)) + 'a';
      pcVar1[10] = ((0 < sVar28) * (sVar28 < 0x100) * (char)sVar28 - (0xff < sVar28)) + 'a';
      pcVar1[0xb] = ((0 < sVar30) * (sVar30 < 0x100) * (char)sVar30 - (0xff < sVar30)) + 'a';
      pcVar1[0xc] = ((0 < sVar32) * (sVar32 < 0x100) * (char)sVar32 - (0xff < sVar32)) + 'a';
      pcVar1[0xd] = ((0 < sVar34) * (sVar34 < 0x100) * (char)sVar34 - (0xff < sVar34)) + 'a';
      pcVar1[0xe] = ((0 < sVar36) * (sVar36 < 0x100) * (char)sVar36 - (0xff < sVar36)) + 'a';
      pcVar1[0xf] = ((0 < sVar38) * (sVar38 < 0x100) * (char)sVar38 - (0xff < sVar38)) + 'a';
      lVar5 = lVar5 + 0x10;
      auVar8._0_2_ = auVar8._0_2_ + 0x10;
      auVar8._2_2_ = sVar12 + 0x10;
      auVar8._4_2_ = sVar14 + 0x10;
      auVar8._6_2_ = sVar16 + 0x10;
      auVar8._8_2_ = sVar18 + 0x10;
      auVar8._10_2_ = sVar20 + 0x10;
      auVar8._12_2_ = sVar22 + 0x10;
      auVar8._14_2_ = sVar24 + 0x10;
      auVar7._0_2_ = auVar7._0_2_ + 0x10;
      auVar7._2_2_ = sVar27 + 0x10;
      auVar7._4_2_ = sVar29 + 0x10;
      auVar7._6_2_ = sVar31 + 0x10;
      auVar7._8_2_ = sVar33 + 0x10;
      auVar7._10_2_ = sVar35 + 0x10;
      auVar7._12_2_ = sVar37 + 0x10;
      auVar7._14_2_ = sVar39 + 0x10;
    } while (lVar5 != 0x800);
    fwrite("[empty_section]\n",0x10,1,__s);
    fwrite("[numeric_section]\n",0x12,1,__s);
    fwrite("int_parameter_1 = 4\n",0x14,1,__s);
    fwrite("int_parameter_2 = 5 ;This is a comment\n",0x27,1,__s);
    fwrite("int_parameter_3 = 6 #This is another type of a comment\n",0x37,1,__s);
    fwrite("# Whole line is a comment\n",0x1a,1,__s);
    fwrite("; Yet another comment line\n",0x1b,1,__s);
    fwrite("float_parameter_1 = 3.24\n",0x19,1,__s);
    fwrite("float_parameter_2 = 0.15\n",0x19,1,__s);
    fwrite("[string_section]\n",0x11,1,__s);
    fwrite("string_parameter_1 = Test string\n",0x21,1,__s);
    fwrite("string_parameter_2 = \"Test string with #\'\"\n",0x2b,1,__s);
    fwrite("string_parameter_3 = \n",0x16,1,__s);
    fwrite("string_parameter_4 = 12345 ;Comment\n",0x24,1,__s);
    fwrite("string_parameter_4 = 54321\n",0x1b,1,__s);
    fwrite("string_parameter_5 = \'Test string\'\n",0x23,1,__s);
    fprintf(__s,"string_parameter_6 = %s\n",lVar4);
    fwrite("string_parameter_7 = \'\'\n",0x18,1,__s);
    fwrite("string_parameter_8 = \"\"\n",0x18,1,__s);
    fprintf(__s,"%s = stress line\n",lVar4);
    fwrite("[boolean_section]\n",0x12,1,__s);
    fwrite("boolean_parameter_1 = TRUE ;True value\n",0x27,1,__s);
    fwrite("boolean_parameter_2 = 0 ;False value\n",0x25,1,__s);
    fwrite("boolean_parameter_3 = false ;False value\n",0x29,1,__s);
    fwrite("boolean_parameter_4 = 1 ;True value\n",0x24,1,__s);
    fwrite("[list_section]\n",0xf,1,__s);
    fwrite("list_parameter_1 = {1\t2\t5\t10} ;First list\n",0x2a,1,__s);
    fwrite("list_parameter_2 = {2.0 3.0 5.0} #Second list\n",0x2e,1,__s);
    fwrite("list_parameter_3 = {true FALSE 1} #Last list\n",0x2d,1,__s);
    if (last_empty_section) {
      fwrite("[empty_section_2]\n",0x12,1,__s);
    }
    p_free(lVar4);
    iVar3 = fclose(__s);
    bVar6 = iVar3 == 0;
  }
  return bVar6;
}

Assistant:

static bool create_test_ini_file (bool last_empty_section)
{
	FILE *file = fopen ("." P_DIR_SEPARATOR "p_ini_test_file.ini", "w");

	if (file == NULL)
		return false;

	pchar *buf = (pchar *) p_malloc0 (PINIFILE_STRESS_LINE + 1);

	for (int i = 0; i < PINIFILE_STRESS_LINE; ++i)
		buf[i] = (pchar) (97 + i % 20);

	/* Empty section */
	fprintf (file, "[empty_section]\n");

	/* Numeric section */
	fprintf (file, "[numeric_section]\n");
	fprintf (file, "int_parameter_1 = 4\n");
	fprintf (file, "int_parameter_2 = 5 ;This is a comment\n");
	fprintf (file, "int_parameter_3 = 6 #This is another type of a comment\n");
	fprintf (file, "# Whole line is a comment\n");
	fprintf (file, "; Yet another comment line\n");
	fprintf (file, "float_parameter_1 = 3.24\n");
	fprintf (file, "float_parameter_2 = 0.15\n");

	/* String section */
	fprintf (file, "[string_section]\n");
	fprintf (file, "string_parameter_1 = Test string\n");
	fprintf (file, "string_parameter_2 = \"Test string with #'\"\n");
	fprintf (file, "string_parameter_3 = \n");
	fprintf (file, "string_parameter_4 = 12345 ;Comment\n");
	fprintf (file, "string_parameter_4 = 54321\n");
	fprintf (file, "string_parameter_5 = 'Test string'\n");
	fprintf (file, "string_parameter_6 = %s\n", buf);
	fprintf (file, "string_parameter_7 = ''\n");
	fprintf (file, "string_parameter_8 = \"\"\n");
	fprintf (file, "%s = stress line\n", buf);

	/* Boolean section */
	fprintf (file, "[boolean_section]\n");
	fprintf (file, "boolean_parameter_1 = TRUE ;True value\n");
	fprintf (file, "boolean_parameter_2 = 0 ;False value\n");
	fprintf (file, "boolean_parameter_3 = false ;False value\n");
	fprintf (file, "boolean_parameter_4 = 1 ;True value\n");

	/* List section */
	fprintf (file, "[list_section]\n");
	fprintf (file, "list_parameter_1 = {1\t2\t5\t10} ;First list\n");
	fprintf (file, "list_parameter_2 = {2.0 3.0 5.0} #Second list\n");
	fprintf (file, "list_parameter_3 = {true FALSE 1} #Last list\n");

	/* Empty section */
	if (last_empty_section)
		fprintf (file, "[empty_section_2]\n");

	p_free (buf);

	return fclose (file) == 0;
}